

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall cmFindPackageCommand::AppendSuccessInformation(cmFindPackageCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  bool found_00;
  cmState *pcVar5;
  char *pcVar6;
  char *val;
  string upperFound;
  string found;
  string quietInfoPropName;
  string requiredInfoPropName;
  string versionInfo;
  string versionInfoPropName;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  char *local_70;
  undefined8 local_68;
  char local_60;
  undefined7 uStack_5f;
  string local_50;
  
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"_CMAKE_","");
  paVar2 = &local_f0.field_2;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  local_f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_f0);
  std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
  cmState::SetGlobalProperty(pcVar5,&local_d0,"False");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->Name)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_d0);
  cmsys::SystemTools::UpperCase(&local_f0,&local_d0);
  pcVar6 = cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_f0);
  val = cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_d0);
  bVar4 = cmSystemTools::IsOn(val);
  found_00 = true;
  if (!bVar4) {
    found_00 = cmSystemTools::IsOn(pcVar6);
  }
  AppendToFoundProperty(this,found_00);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"_CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(this->Name)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_b0);
  pcVar5 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
  pcVar6 = "FALSE";
  if (this->Quiet != false) {
    pcVar6 = "TRUE";
  }
  cmState::SetGlobalProperty(pcVar5,&local_b0,pcVar6);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)(this->Name)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_50);
  local_68 = 0;
  local_60 = '\0';
  local_70 = &local_60;
  if ((this->Version)._M_string_length != 0) {
    pcVar6 = ">=";
    if (this->VersionExact != false) {
      pcVar6 = "==";
    }
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar6);
    std::__cxx11::string::append((char *)&local_70);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)(this->Version)._M_dataplus._M_p);
  }
  pcVar5 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
  cmState::SetGlobalProperty(pcVar5,&local_50,local_70);
  if (this->Required == true) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"_CMAKE_","");
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)(this->Name)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_90);
    pcVar5 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
    cmState::SetGlobalProperty(pcVar5,&local_90,"REQUIRED");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  RestoreFindDefinitions(this);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&((this->super_cmFindCommon).super_cmCommand.Makefile)->FindPackageModuleStack);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::AppendSuccessInformation()
{
  {
    std::string transitivePropName = "_CMAKE_";
    transitivePropName += this->Name + "_TRANSITIVE_DEPENDENCY";
    this->Makefile->GetState()->SetGlobalProperty(transitivePropName, "False");
  }
  std::string found = this->Name;
  found += "_FOUND";
  std::string upperFound = cmSystemTools::UpperCase(found);

  const char* upperResult = this->Makefile->GetDefinition(upperFound);
  const char* result = this->Makefile->GetDefinition(found);
  bool packageFound =
    ((cmSystemTools::IsOn(result)) || (cmSystemTools::IsOn(upperResult)));

  this->AppendToFoundProperty(packageFound);

  // Record whether the find was quiet or not, so this can be used
  // e.g. in FeatureSummary.cmake
  std::string quietInfoPropName = "_CMAKE_";
  quietInfoPropName += this->Name;
  quietInfoPropName += "_QUIET";
  this->Makefile->GetState()->SetGlobalProperty(
    quietInfoPropName, this->Quiet ? "TRUE" : "FALSE");

  // set a global property to record the required version of this package
  std::string versionInfoPropName = "_CMAKE_";
  versionInfoPropName += this->Name;
  versionInfoPropName += "_REQUIRED_VERSION";
  std::string versionInfo;
  if (!this->Version.empty()) {
    versionInfo = this->VersionExact ? "==" : ">=";
    versionInfo += " ";
    versionInfo += this->Version;
  }
  this->Makefile->GetState()->SetGlobalProperty(versionInfoPropName,
                                                versionInfo.c_str());
  if (this->Required) {
    std::string requiredInfoPropName = "_CMAKE_";
    requiredInfoPropName += this->Name;
    requiredInfoPropName += "_TYPE";
    this->Makefile->GetState()->SetGlobalProperty(requiredInfoPropName,
                                                  "REQUIRED");
  }

  // Restore original state of "_FIND_" variables we set.
  this->RestoreFindDefinitions();

  // Pop the package stack
  this->Makefile->FindPackageModuleStack.pop_back();
}